

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int verify_miniscript_older(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  miniscript_node_t *pmVar2;
  int iVar3;
  
  iVar3 = 0;
  pmVar1 = node->child;
  for (pmVar2 = pmVar1; pmVar2 != (miniscript_node_t *)0x0; pmVar2 = pmVar2->next) {
    iVar3 = iVar3 + 1;
  }
  if ((((iVar3 == node->info->inner_num) && (pmVar1->info == (miniscript_item_t *)0x0)) &&
      (pmVar1->kind == 8)) && (0xffffffff80000000 < pmVar1->number - 0x80000000U)) {
    node->type_properties = node->info->type_properties;
    return 0;
  }
  return -2;
}

Assistant:

static int verify_miniscript_older(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    if ((get_child_list_count(node) != node->info->inner_num) || node->child->info ||
        (node->child->kind != DESCRIPTOR_KIND_NUMBER) ||
        (node->child->number <= 0) || (node->child->number > 0x7fffffff))
        return WALLY_EINVAL;

    node->type_properties = node->info->type_properties;
    return WALLY_OK;
}